

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O3

void __thiscall
robin_hood::detail::
Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::
Destroyer<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
::nodesDoNotDeallocate
          (Destroyer<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_false>
           *this,Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *m)

{
  Node *pNVar1;
  long *plVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  ulong uVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  m->mNumElements = 0;
  uVar4 = m->mMask + 1;
  if (uVar4 < 0x28f5c28f5c28f5d) {
    uVar5 = (uVar4 * 0x50) / 100;
  }
  else {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar4 >> 2;
    uVar5 = (SUB168(auVar3 * ZEXT816(0x28f5c28f5c28f5c3),8) & 0x3ffffffffffffffc) * 0x14;
  }
  uVar9 = 0xff;
  if (uVar5 < 0xff) {
    uVar9 = uVar5;
  }
  if (uVar9 + uVar4 != 0) {
    lVar7 = 0x10;
    lVar8 = 0;
    do {
      if (m->mInfo[lVar8] != '\0') {
        pNVar1 = m->mKeyVals;
        plVar6 = (long *)((long)&(pNVar1->mData).first._M_dataplus._M_p + lVar7);
        std::unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_>::~unique_ptr
                  ((unique_ptr<Rml::FontFamily,_std::default_delete<Rml::FontFamily>_> *)
                   ((long)&(pNVar1->mData).first.field_2 + lVar7));
        plVar2 = *(long **)((long)pNVar1 + lVar7 + -0x10);
        if (plVar6 != plVar2) {
          operator_delete(plVar2,*plVar6 + 1);
        }
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x28;
    } while (uVar9 + uVar4 != lVar8);
  }
  return;
}

Assistant:

void nodesDoNotDeallocate(M& m) const noexcept {
            m.mNumElements = 0;
            // clear also resets mInfo to 0, that's sometimes not necessary.
            auto const numElementsWithBuffer = m.calcNumElementsWithBuffer(m.mMask + 1);
            for (size_t idx = 0; idx < numElementsWithBuffer; ++idx) {
                if (0 != m.mInfo[idx]) {
                    Node& n = m.mKeyVals[idx];
                    n.destroyDoNotDeallocate();
                    n.~Node();
                }
            }
        }